

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::BitwiseXorExp(SQParser *this)

{
  uint uVar1;
  Expr *pEVar2;
  int iVar3;
  
  uVar1 = this->_depth;
  if (500 < uVar1) {
    reportDiagnostic(this,0x1d);
    uVar1 = this->_depth;
  }
  this->_depth = uVar1 + 1;
  pEVar2 = BitwiseAndExp(this);
  iVar3 = 1;
  while( true ) {
    uVar1 = this->_depth;
    if (500 < uVar1) {
      reportDiagnostic(this,0x1d);
      uVar1 = this->_depth;
    }
    this->_depth = uVar1 + 1;
    if (this->_token != 0x5e) break;
    iVar3 = iVar3 + 1;
    pEVar2 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                       (this,0x161c8a,TO_BLOCK,(Expr *)&DAT_00000018);
  }
  this->_depth = uVar1 - iVar3;
  return pEVar2;
}

Assistant:

Expr* SQParser::BitwiseXorExp()
{
    NestingChecker nc(this);
    Expr * lhs = BitwiseAndExp();
    for (;;) {
        nc.inc();
        if (_token == _SC('^')) {
            lhs = BIN_EXP(&SQParser::BitwiseAndExp, TO_XOR, lhs);
        }
        else return lhs;
    }
}